

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChTetrahedronFace.h
# Opt level: O1

void __thiscall
chrono::fea::ChTetrahedronFace::ComputeNF
          (ChTetrahedronFace *this,double U,double V,ChVectorDynamic<> *Qi,double *detJ,
          ChVectorDynamic<> *F,ChVectorDynamic<> *state_x,ChVectorDynamic<> *state_w)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  long lVar9;
  long lVar10;
  double *pdVar11;
  double *pdVar12;
  int i;
  double dVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  ChLoadableUV local_38;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_30;
  
  i = (int)this;
  GetNodeN((ChTetrahedronFace *)&local_38,i);
  dVar13 = *(double *)((long)local_38 + 0x20);
  dVar1 = *(double *)((long)local_38 + 0x28);
  dVar2 = *(double *)((long)local_38 + 0x30);
  if (local_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_30);
  }
  GetNodeN((ChTetrahedronFace *)&local_38,i);
  dVar3 = *(double *)((long)local_38 + 0x20);
  dVar4 = *(double *)((long)local_38 + 0x28);
  dVar5 = *(double *)((long)local_38 + 0x30);
  if (local_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_30);
  }
  GetNodeN((ChTetrahedronFace *)&local_38,i);
  dVar6 = *(double *)((long)local_38 + 0x20);
  dVar7 = *(double *)((long)local_38 + 0x28);
  dVar8 = *(double *)((long)local_38 + 0x30);
  if (local_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_30);
  }
  dVar6 = dVar6 - dVar13;
  dVar7 = dVar7 - dVar1;
  dVar8 = dVar8 - dVar2;
  dVar3 = dVar3 - dVar13;
  dVar4 = dVar4 - dVar1;
  dVar5 = dVar5 - dVar2;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = dVar7;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = dVar5;
  auVar23._8_8_ = 0;
  auVar23._0_8_ = dVar4 * dVar8;
  auVar16 = vfmsub231sd_fma(auVar23,auVar16,auVar21);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = dVar8;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = dVar3;
  auVar22._8_8_ = 0;
  auVar22._0_8_ = dVar5 * dVar6;
  auVar18 = vfmsub231sd_fma(auVar22,auVar19,auVar18);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = dVar6;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = dVar3 * dVar7;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = dVar4;
  auVar14 = vfmsub231sd_fma(auVar17,auVar14,auVar20);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = auVar18._0_8_ * auVar18._0_8_;
  auVar16 = vfmadd231sd_fma(auVar15,auVar16,auVar16);
  auVar16 = vfmadd231sd_fma(auVar16,auVar14,auVar14);
  if (auVar16._0_8_ < 0.0) {
    dVar13 = sqrt(auVar16._0_8_);
  }
  else {
    auVar16 = vsqrtsd_avx(auVar16,auVar16);
    dVar13 = auVar16._0_8_;
  }
  *detJ = dVar13;
  lVar9 = (F->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  if (0 < lVar9) {
    lVar10 = (Qi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
    if (0 < lVar10) {
      dVar13 = (1.0 - U) - V;
      pdVar11 = (F->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
      ;
      pdVar12 = (Qi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                m_data;
      *pdVar12 = dVar13 * *pdVar11;
      if (lVar9 == 1) goto LAB_0064647a;
      if (lVar10 != 1) {
        pdVar12[1] = dVar13 * pdVar11[1];
        if (lVar9 < 3) goto LAB_0064647a;
        if ((((2 < lVar10) && (pdVar12[2] = dVar13 * pdVar11[2], lVar10 != 3)) &&
            (pdVar12[3] = U * *pdVar11, 4 < lVar10)) &&
           (((pdVar12[4] = U * pdVar11[1], lVar10 != 5 && (pdVar12[5] = U * pdVar11[2], 6 < lVar10))
            && ((pdVar12[6] = V * *pdVar11, lVar10 != 7 && (pdVar12[7] = V * pdVar11[1], 8 < lVar10)
                ))))) {
          pdVar12[8] = V * pdVar11[2];
          return;
        }
      }
    }
    __assert_fail("index >= 0 && index < size()",
                  "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                  "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                 );
  }
LAB_0064647a:
  __assert_fail("index >= 0 && index < size()",
                "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0xb5,
                "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 0>::operator()(Index) const [Derived = Eigen::Matrix<double, -1, 1>, Level = 0]"
               );
}

Assistant:

virtual void ComputeNF(const double U,              ///< parametric coordinate in surface
                           const double V,              ///< parametric coordinate in surface
                           ChVectorDynamic<>& Qi,       ///< result of N'*F , maybe with offset block_offset
                           double& detJ,                ///< det[J]
                           const ChVectorDynamic<>& F,  ///< Input F vector, size is = n.field coords.
                           ChVectorDynamic<>* state_x,  ///< if != 0, update state (pos. part) to this, then evaluate Q
                           ChVectorDynamic<>* state_w   ///< if != 0, update state (speed part) to this, then evaluate Q
                           ) override {
        // evaluate shape functions (in compressed vector), btw. not dependant on state
        // note: U,V in 0..1 range, thanks to IsTriangleIntegrationNeeded() {return true;}
        ChVectorN<double, 3> N;
        this->ShapeFunctions(N, U, V);

        // determinant of jacobian is also =2*areaoftriangle, also length of cross product of sides
        ChVector<> p0 = GetNodeN(0)->GetPos();
        ChVector<> p1 = GetNodeN(1)->GetPos();
        ChVector<> p2 = GetNodeN(2)->GetPos();
        detJ = (Vcross(p2 - p0, p1 - p0)).Length();

        Qi(0) = N(0) * F(0);
        Qi(1) = N(0) * F(1);
        Qi(2) = N(0) * F(2);
        Qi(3) = N(1) * F(0);
        Qi(4) = N(1) * F(1);
        Qi(5) = N(1) * F(2);
        Qi(6) = N(2) * F(0);
        Qi(7) = N(2) * F(1);
        Qi(8) = N(2) * F(2);
    }